

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_armor_upgrades.hpp
# Opt level: O2

uint32_t PatchArmorUpgrades::inject_function_alter_item_given_by_ground_source
                   (ROM *rom,uint32_t function_alter_item_in_d0)

{
  uint32_t uVar1;
  allocator<char> local_b9;
  string local_b8;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_string_length._0_1_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpib(&func,'\f',(Param *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"return",&local_b9);
  md::Code::bgt(&func,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8._M_string_length._0_1_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  md::Code::cmpib(&func,'\t',(Param *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"return",&local_b9);
  md::Code::blt(&func,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  md::Code::jsr(&func,function_alter_item_in_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"return",&local_b9);
  md::Code::label(&func,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8._M_string_length._0_1_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&func,0xff1040,(AddressRegister *)&local_b8);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  uVar1 = md::ROM::inject_code(rom,&func,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  md::Code::~Code(&func);
  return uVar1;
}

Assistant:

[[nodiscard]] static uint32_t inject_function_alter_item_given_by_ground_source(md::ROM& rom,
                                                                                    uint32_t function_alter_item_in_d0)
    {
        md::Code func;
        {
            func.cmpib(ITEM_HYPER_BREAST, reg_D0);
            func.bgt("return");
            func.cmpib(ITEM_STEEL_BREAST, reg_D0);
            func.blt("return");
            {
                func.jsr(function_alter_item_in_d0);
            }
        }
        func.label("return");
        func.lea(0xFF1040, reg_A0);
        func.rts();

        return rom.inject_code(func);
    }